

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  int iVar1;
  QLoggingCategory *pQVar2;
  char *category;
  element_type *peVar3;
  bool bVar4;
  char local_b8 [8];
  char buffer [80];
  QMessageLogger local_58;
  QDebug local_38 [15];
  bool local_29;
  int *piStack_28;
  bool qt_category_enabled;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  piStack_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  while( true ) {
    iVar1 = std::istream::peek();
    bVar4 = false;
    if (iVar1 != 10) {
      iVar1 = std::istream::peek();
      bVar4 = false;
      if (iVar1 != 0x3d) {
        iVar1 = std::istream::peek();
        bVar4 = iVar1 != 0x5b;
      }
    }
    if (!bVar4) break;
    std::istream::ignore();
  }
  iVar1 = std::istream::peek();
  if (iVar1 == 10) {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,end_property_state);
  }
  else {
    iVar1 = std::istream::peek();
    if (iVar1 == 0x3d) {
      std::istream::ignore();
      clear_empty((ifstream *)error_local);
      iVar1 = std::istream::peek();
      if (iVar1 == 0x7b) {
        pQVar2 = parser();
        local_29 = QLoggingCategory::isDebugEnabled(pQVar2);
        while (local_29 != false) {
          pQVar2 = parser();
          category = QLoggingCategory::categoryName(pQVar2);
          QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0,category);
          QMessageLogger::debug();
          QDebug::operator<<(local_38,"starting the set property set");
          QDebug::~QDebug(local_38);
          local_29 = false;
        }
        std::
        function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
        ::
        function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
                  ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                    *)__return_storage_ptr__,begin_property_set_state);
      }
      else {
        std::istream::getline((char *)error_local,(long)local_b8,'P');
        peVar3 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(anonymous_namespace)::current_property);
        std::__cxx11::string::operator=((string *)&peVar3->default_value,local_b8);
        std::
        function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
        ::
        function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
                  ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                    *)__return_storage_ptr__,end_property_state);
      }
    }
    else {
      std::
      function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
      ::function(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t property_state(MetaConfiguration &conf, std::ifstream &f,
                          int &error) {
  while (f.peek() != '\n' && f.peek() != '=' && f.peek() != '[') {
    f.ignore();
  }

  // easy, line finished, next property or class.
  if (f.peek() == '\n') {
    return end_property_state;
  } else if (f.peek() == '=') {
    f.ignore();
    clear_empty(f);
    if (f.peek() == '{') {
      qCDebug(parser) << "starting the set property set";
      return begin_property_set_state;
    } else {
      char buffer[80];
      f.getline(buffer, 80, '\n');
      current_property->default_value = buffer;
      return end_property_state;
    }
  }
  return nullptr;
}